

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

FIOBJ fiobj_str_new(char *str,size_t len)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined8 extraout_RDX;
  size_t sVar4;
  undefined8 uVar5;
  undefined1 *__dest;
  long *in_FS_OFFSET;
  fio_str_info_s fStack_70;
  code *pcStack_58;
  fio_str_info_s local_30;
  
  uVar5 = 0x40;
  sVar4 = len;
  puVar2 = (undefined1 *)fio_malloc(0x40);
  if (puVar2 != (undefined1 *)0x0) {
    *puVar2 = 0x28;
    *(undefined4 *)(puVar2 + 4) = 1;
    *(undefined8 *)(puVar2 + 8) = 0;
    puVar2[0x10] = 1;
    *(undefined8 *)(puVar2 + 0x11) = 0;
    *(undefined8 *)(puVar2 + 0x19) = 0;
    *(undefined8 *)(puVar2 + 0x21) = 0;
    *(undefined8 *)(puVar2 + 0x29) = 0;
    *(undefined8 *)(puVar2 + 0x30) = 0;
    *(undefined8 *)(puVar2 + 0x38) = 0;
    if ((len != 0 && str != (char *)0x0) && (puVar2[0x11] == '\0')) {
      if (len < 0x2e) {
        puVar2[0x10] = (char)len * '\x02' + '\x01';
        __dest = puVar2 + 0x12;
        puVar2[len + 0x12] = 0;
      }
      else {
        puVar2[0x10] = 0x5b;
        fio_str_capa_assert(&local_30,(fio_str_s_conflict *)(puVar2 + 0x10),len);
        *(size_t *)(puVar2 + 0x28) = len;
        *(undefined1 *)(*(long *)(puVar2 + 0x38) + len) = 0;
        __dest = *(undefined1 **)(puVar2 + 0x38);
      }
      memcpy(__dest,str,len);
    }
    return (ulong)puVar2 | 2;
  }
  fiobj_str_new_cold_1();
  pcStack_58 = (code *)0x1439b8;
  puVar2 = (undefined1 *)fio_malloc(0x40);
  if (puVar2 != (undefined1 *)0x0) {
    *puVar2 = 0x28;
    *(undefined4 *)(puVar2 + 4) = 1;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 0x10) = 0;
    *(undefined8 *)(puVar2 + 0x18) = 0;
    *(undefined8 *)(puVar2 + 0x20) = extraout_RDX;
    *(size_t *)(puVar2 + 0x28) = sVar4;
    *(code **)(puVar2 + 0x30) = fio_free;
    *(undefined8 *)(puVar2 + 0x38) = uVar5;
    return (ulong)puVar2 | 2;
  }
  pcStack_58 = fiobj_str_tmp;
  fiobj_str_move_cold_1();
  lVar1 = *in_FS_OFFSET;
  *(undefined1 *)((long)in_FS_OFFSET + -0x2e7) = 0;
  if (((char)in_FS_OFFSET[-0x5d] == '\0') && (in_FS_OFFSET[-0x58] != 0)) {
    if (in_FS_OFFSET[-0x5b] == 0) {
      lVar3 = 0;
      if (in_FS_OFFSET[-0x59] == 0) {
        lVar3 = in_FS_OFFSET[-0x5a];
      }
      in_FS_OFFSET[-0x5a] = lVar3;
      pcStack_58 = (code *)uVar5;
      fio_str_capa_assert(&fStack_70,(fio_str_s_conflict *)(lVar1 + -0x2e8),0);
    }
    in_FS_OFFSET[-0x5a] = 0;
    *(undefined1 *)in_FS_OFFSET[-0x58] = 0;
  }
  else {
    *(undefined1 *)(in_FS_OFFSET + -0x5d) = 1;
    *(undefined1 *)((long)in_FS_OFFSET + -0x2e6) = 0;
  }
  return lVar1 - 0x2f8U | 2;
}

Assistant:

FIOBJ fiobj_str_new(const char *str, size_t len) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (str && len) {
    fio_str_write(&s->str, str, len);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}